

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O1

void __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false>::
EnsureSlotCapacity(SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false>
                   *this,DynamicObject *instance)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined4 *puVar5;
  uint left;
  
  if (0xfffd < (this->super_DynamicTypeHandler).slotCapacity) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x9fd,"(this->GetSlotCapacity() < MaxPropertyIndexSize)",
                                "this->GetSlotCapacity() < MaxPropertyIndexSize");
    if (!bVar2) goto LAB_00e03c27;
    *puVar5 = 0;
  }
  if (this->nextPropertyIndex == 0xffff) {
    ::Math::DefaultOverflowPolicy();
  }
  left = this->nextPropertyIndex + 1 & 0xffff;
  iVar3 = ::Math::Add<int>(left,left >> 2);
  iVar4 = 0xfffe;
  if (iVar3 < 0xfffe) {
    iVar4 = iVar3;
  }
  iVar4 = DynamicTypeHandler::RoundUpSlotCapacity
                    (iVar4,(this->super_DynamicTypeHandler).inlineSlotCapacity);
  if (0xfffe < iVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0xa0c,"(newSlotCapacity <= MaxPropertyIndexSize)",
                                "newSlotCapacity <= MaxPropertyIndexSize");
    if (!bVar2) {
LAB_00e03c27:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  DynamicObject::EnsureSlots
            (instance,(this->super_DynamicTypeHandler).slotCapacity,iVar4,
             (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr,&this->super_DynamicTypeHandler);
  (this->super_DynamicTypeHandler).slotCapacity = iVar4;
  return;
}

Assistant:

void SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::EnsureSlotCapacity(DynamicObject * instance)
    {
        Assert(this->GetSlotCapacity() < MaxPropertyIndexSize); // Otherwise we can't grow this handler's capacity. We should've evolved to bigger handler or OOM.

        // This check should be done by caller of this function.
        //if (slotCapacity <= nextPropertyIndex)
        {
            // A Dictionary type is expected to have more properties
            // grow exponentially rather linearly to avoid the realloc and moves,
            // however use a small exponent to avoid waste
            int newSlotCapacity = ::Math::Add(nextPropertyIndex, (TPropertyIndex)1);
            newSlotCapacity = ::Math::Add(newSlotCapacity, newSlotCapacity >> 2);
            if (newSlotCapacity > MaxPropertyIndexSize)
            {
                newSlotCapacity = MaxPropertyIndexSize;
            }
            newSlotCapacity = RoundUpSlotCapacity(newSlotCapacity, GetInlineSlotCapacity());
            Assert(newSlotCapacity <= MaxPropertyIndexSize);

            instance->EnsureSlots(this->GetSlotCapacity(), newSlotCapacity, instance->GetScriptContext(), this);
            this->SetSlotCapacity(newSlotCapacity);
        }
    }